

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::rayTestSingleInternal::RayTester::ProcessLeaf(RayTester *this,int i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  ulong uVar8;
  cbtTransform *pcVar9;
  cbtCompoundShapeChild *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  cbtCollisionObjectWrapper tmpOb;
  cbtCollisionObjectWrapper local_a0;
  RayResultCallback local_78;
  RayResultCallback *local_50;
  int local_48;
  cbtTransform local_40;
  
  pcVar9 = this->m_colObjWorldTransform;
  pcVar10 = (this->m_compoundShape->m_children).m_data;
  fVar1 = (pcVar9->m_basis).m_el[0].m_floats[1];
  auVar16._4_4_ = fVar1;
  auVar16._0_4_ = fVar1;
  auVar16._8_4_ = fVar1;
  auVar16._12_4_ = fVar1;
  fVar2 = (pcVar9->m_basis).m_el[1].m_floats[1];
  auVar20._4_4_ = fVar2;
  auVar20._0_4_ = fVar2;
  auVar20._8_4_ = fVar2;
  auVar20._12_4_ = fVar2;
  fVar3 = (pcVar9->m_basis).m_el[2].m_floats[1];
  auVar23._4_4_ = fVar3;
  auVar23._0_4_ = fVar3;
  auVar23._8_4_ = fVar3;
  auVar23._12_4_ = fVar3;
  cVar4 = (pcVar9->m_basis).m_el[0].m_floats[0];
  auVar18._4_4_ = cVar4;
  auVar18._0_4_ = cVar4;
  auVar18._8_4_ = cVar4;
  auVar18._12_4_ = cVar4;
  cVar4 = (pcVar9->m_basis).m_el[1].m_floats[0];
  auVar21._4_4_ = cVar4;
  auVar21._0_4_ = cVar4;
  auVar21._8_4_ = cVar4;
  auVar21._12_4_ = cVar4;
  cVar4 = (pcVar9->m_basis).m_el[2].m_floats[0];
  auVar24._4_4_ = cVar4;
  auVar24._0_4_ = cVar4;
  auVar24._8_4_ = cVar4;
  auVar24._12_4_ = cVar4;
  cVar4 = (pcVar9->m_basis).m_el[0].m_floats[2];
  auVar19._4_4_ = cVar4;
  auVar19._0_4_ = cVar4;
  auVar19._8_4_ = cVar4;
  auVar19._12_4_ = cVar4;
  cVar4 = (pcVar9->m_basis).m_el[1].m_floats[2];
  auVar22._4_4_ = cVar4;
  auVar22._0_4_ = cVar4;
  auVar22._8_4_ = cVar4;
  auVar22._12_4_ = cVar4;
  cVar4 = (pcVar9->m_basis).m_el[2].m_floats[2];
  auVar25._4_4_ = cVar4;
  auVar25._0_4_ = cVar4;
  auVar25._8_4_ = cVar4;
  auVar25._12_4_ = cVar4;
  fVar5 = pcVar10[i].m_transform.m_basis.m_el[1].m_floats[2];
  cVar4 = pcVar10[i].m_transform.m_basis.m_el[0].m_floats[2];
  cVar6 = pcVar10[i].m_transform.m_basis.m_el[2].m_floats[2];
  cVar7 = pcVar10[i].m_transform.m_origin.m_floats[2];
  local_a0.m_shape = pcVar10[i].m_childShape;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),ZEXT416((uint)cVar4),auVar18);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar2)),ZEXT416((uint)cVar4),auVar21);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar5)),auVar24,ZEXT416((uint)cVar4));
  cVar4 = pcVar10[i].m_transform.m_origin.m_floats[0];
  auVar12 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar6),auVar19);
  auVar13 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar6),auVar22);
  auVar11 = vfmadd231ss_fma(auVar11,auVar25,ZEXT416((uint)cVar6));
  fVar2 = pcVar10[i].m_transform.m_origin.m_floats[1];
  auVar14 = vmulss_avx512f(auVar20,ZEXT416((uint)fVar2));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),ZEXT416((uint)cVar4),auVar18);
  auVar15 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)cVar4),auVar21);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar2)),auVar24,ZEXT416((uint)cVar4));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar7),auVar19);
  auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)cVar7),auVar22);
  auVar15 = vaddss_avx512f(auVar15,ZEXT416((uint)(pcVar9->m_origin).m_floats[1]));
  auVar14 = vfmadd231ss_fma(auVar14,auVar25,ZEXT416((uint)cVar7));
  uVar8 = *(ulong *)pcVar10[i].m_transform.m_basis.m_el[1].m_floats;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)pcVar10[i].m_transform.m_basis.m_el[2].m_floats;
  local_a0.m_worldTransform = &local_40;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar8;
  auVar16 = vmulps_avx512vl(auVar16,auVar27);
  auVar17 = vinsertps_avx(ZEXT416((uint)(auVar17._0_4_ + (pcVar9->m_origin).m_floats[0])),auVar15,
                          0x10);
  local_40.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar17,ZEXT416((uint)(auVar14._0_4_ + (pcVar9->m_origin).m_floats[2])),0x28);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)pcVar10[i].m_transform.m_basis.m_el[0].m_floats;
  auVar17 = vfmadd231ps_fma(auVar16,auVar15,auVar18);
  auVar17 = vfmadd231ps_fma(auVar17,auVar26,auVar19);
  auVar14 = vmulps_avx512vl(auVar27,auVar20);
  auVar14 = vfmadd231ps_fma(auVar14,auVar15,auVar21);
  local_40.m_basis.m_el[0].m_floats._0_8_ = vmovlps_avx(auVar17);
  local_40.m_basis.m_el[0].m_floats[2] = auVar12._0_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar8;
  auVar17 = vmulps_avx512vl(auVar17,auVar23);
  local_40.m_basis.m_el[0].m_floats[3] = 0.0;
  auVar17 = vfmadd231ps_fma(auVar17,auVar15,auVar24);
  auVar14 = vfmadd231ps_fma(auVar14,auVar26,auVar22);
  auVar17 = vfmadd231ps_fma(auVar17,auVar26,auVar25);
  local_40.m_basis.m_el[1].m_floats._0_8_ = vmovlps_avx(auVar14);
  local_40.m_basis.m_el[1].m_floats[2] = auVar13._0_4_;
  local_40.m_basis.m_el[1].m_floats[3] = 0.0;
  local_40.m_basis.m_el[2].m_floats._0_8_ = vmovlps_avx(auVar17);
  local_40.m_basis.m_el[2].m_floats[2] = auVar11._0_4_;
  local_40.m_basis.m_el[2].m_floats[3] = 0.0;
  local_a0.m_collisionObject = this->m_collisionObject;
  local_a0.m_parent = (cbtCollisionObjectWrapper *)0x0;
  local_a0.m_partId = -1;
  local_50 = this->m_resultCallback;
  local_78.m_collisionObject = (cbtCollisionObject *)0x0;
  local_78.m_collisionFilterGroup = 1;
  local_78.m_collisionFilterMask = -1;
  local_78._vptr_RayResultCallback = (_func_int **)&PTR__RayResultCallback_00b47ea0;
  local_78.m_closestHitFraction = local_50->m_closestHitFraction;
  local_78.m_flags = local_50->m_flags;
  local_a0.m_index = i;
  local_48 = i;
  rayTestSingleInternal(this->m_rayFromTrans,this->m_rayToTrans,&local_a0,&local_78);
  return;
}

Assistant:

void ProcessLeaf(int i)
					{
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(i);
						const cbtTransform& childTrans = m_compoundShape->getChildTransform(i);
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						cbtCollisionObjectWrapper tmpOb(0, childCollisionShape, m_collisionObject, childWorldTrans, -1, i);
						// replace collision shape so that callback can determine the triangle

						LocalInfoAdder2 my_cb(i, &m_resultCallback);

						rayTestSingleInternal(
							m_rayFromTrans,
							m_rayToTrans,
							&tmpOb,
							my_cb);
					}